

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmder.c
# Opt level: O1

int lmder(cminpack_funcder_mn fcnder_mn,void *p,int m,int n,double *x,double *fvec,double *fjac,
         int ldfjac,double ftol,double xtol,double gtol,int maxfev,double *diag,int mode,
         double factor,int nprint,int *nfev,int *njev,int *ipvt,double *qtf,double *wa1,double *wa2,
         double *wa3,double *wa4)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 uVar17;
  byte bVar18;
  undefined8 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  uint local_150;
  double par;
  double local_128;
  undefined8 uStack_120;
  ulong local_118;
  double *local_110;
  double local_108;
  ulong uStack_100;
  void *local_f0;
  cminpack_funcder_mn local_e8;
  ulong local_e0;
  double local_d8;
  undefined8 uStack_d0;
  long local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  long local_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58;
  long local_50;
  double local_48;
  
  uVar6 = (ulong)(uint)n;
  local_110 = x;
  local_c0 = factor;
  local_b8 = gtol;
  local_a8 = xtol;
  local_48 = ftol;
  local_58 = dpmpar(1);
  pdVar12 = local_110;
  uVar11 = 0;
  *nfev = 0;
  *njev = 0;
  local_f0 = p;
  local_e8 = fcnder_mn;
  if (m < n || n < 1) {
    local_150 = 0;
  }
  else {
    if (ldfjac < m) {
      local_150 = 0;
      goto LAB_001023a2;
    }
    if ((((local_48 < 0.0) || (local_a8 < 0.0)) || (local_b8 < 0.0)) ||
       ((maxfev < 1 || (local_c0 <= 0.0)))) {
      local_150 = 0;
      uVar11 = 0;
      goto LAB_001023a2;
    }
    if (0 < n && mode == 2) {
      uVar3 = 0;
      do {
        if (diag[uVar3] <= 0.0) {
          local_150 = 0;
          uVar11 = 0;
          goto LAB_001023a2;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
    local_150 = (*fcnder_mn)(p,m,n,local_110,fvec,fjac,ldfjac,1);
    *nfev = 1;
    if (-1 < (int)local_150) {
      local_128 = enorm(m,fvec);
      par = 0.0;
      uStack_120 = extraout_XMM0_Qb;
      local_150 = (*fcnder_mn)(p,m,n,pdVar12,fvec,fjac,ldfjac,2);
      *njev = *njev + 1;
      if (-1 < (int)local_150) {
        local_a0 = (long)m;
        local_e0 = (ulong)(uint)m;
        local_50 = (long)ldfjac * 8 + 8;
        local_c8 = (long)ldfjac << 3;
        local_118 = 1;
        local_d8 = 0.0;
        local_108 = 0.0;
        uStack_100 = 0;
        while( true ) {
          if (0 < nprint) {
            local_150 = 0;
            if (((int)local_118 + -1) % nprint == 0) {
              local_150 = (*local_e8)(local_f0,m,n,pdVar12,fvec,fjac,ldfjac,0);
            }
            uVar11 = 0;
            if ((int)local_150 < 0) goto LAB_001023a2;
          }
          qrfac(m,n,fjac,ldfjac,1,ipvt,n,wa1,wa2,wa3);
          dVar20 = local_108;
          uVar3 = uStack_100;
          if ((int)local_118 == 1) {
            if (0 < n && mode != 2) {
              uVar3 = 0;
              do {
                diag[uVar3] = wa2[uVar3];
                if ((wa2[uVar3] == 0.0) && (!NAN(wa2[uVar3]))) {
                  diag[uVar3] = 1.0;
                }
                uVar3 = uVar3 + 1;
              } while (uVar6 != uVar3);
            }
            if (0 < n) {
              uVar3 = 0;
              do {
                wa3[uVar3] = diag[uVar3] * pdVar12[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar6 != uVar3);
            }
            local_d8 = enorm(n,wa3);
            dVar20 = local_d8 * local_c0;
            uVar3 = extraout_XMM0_Qb_00;
            if ((dVar20 == 0.0) && (!NAN(dVar20))) {
              uVar3 = 0;
              dVar20 = local_c0;
            }
          }
          if (0 < m) {
            uVar1 = 0;
            do {
              wa4[uVar1] = fvec[uVar1];
              uVar1 = uVar1 + 1;
            } while (local_e0 != uVar1);
          }
          if (0 < n) {
            uVar7 = 0;
            uVar1 = local_e0;
            pdVar4 = wa4;
            pdVar5 = fjac;
            do {
              lVar9 = (long)((int)uVar7 * ldfjac);
              dVar21 = fjac[uVar7 + lVar9];
              if ((dVar21 != 0.0) || (NAN(dVar21))) {
                dVar14 = 0.0;
                if ((long)uVar7 < local_a0) {
                  uVar10 = 0;
                  do {
                    dVar14 = dVar14 + pdVar5[uVar10] * pdVar4[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                }
                if ((long)uVar7 < local_a0) {
                  uVar10 = 0;
                  do {
                    pdVar4[uVar10] = pdVar5[uVar10] * (-dVar14 / dVar21) + pdVar4[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar1 != uVar10);
                }
              }
              fjac[uVar7 + lVar9] = wa1[uVar7];
              qtf[uVar7] = wa4[uVar7];
              uVar7 = uVar7 + 1;
              pdVar5 = (double *)((long)pdVar5 + local_50);
              pdVar4 = pdVar4 + 1;
              uVar1 = uVar1 - 1;
            } while (uVar7 != uVar6);
          }
          dVar21 = 0.0;
          if (local_128 != 0.0 && 0 < n) {
            lVar9 = 1;
            uVar1 = 0;
            pdVar4 = fjac;
            do {
              dVar14 = wa2[(long)ipvt[uVar1] + -1];
              if ((dVar14 != 0.0) || (NAN(dVar14))) {
                dVar15 = 0.0;
                lVar8 = 0;
                do {
                  dVar15 = dVar15 + (qtf[lVar8] / local_128) * pdVar4[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar9 != lVar8);
                uVar7 = -(ulong)(ABS(dVar15 / dVar14) <= dVar21);
                dVar21 = (double)(uVar7 & (ulong)dVar21 | ~uVar7 & (ulong)ABS(dVar15 / dVar14));
              }
              uVar1 = uVar1 + 1;
              lVar9 = lVar9 + 1;
              pdVar4 = (double *)((long)pdVar4 + local_c8);
            } while (uVar1 != uVar6);
          }
          if (dVar21 <= local_b8) break;
          if (0 < n && mode != 2) {
            uVar1 = 0;
            do {
              uVar7 = -(ulong)(wa2[uVar1] <= diag[uVar1]);
              diag[uVar1] = (double)(~uVar7 & (ulong)wa2[uVar1] | (ulong)diag[uVar1] & uVar7);
              uVar1 = uVar1 + 1;
            } while (uVar6 != uVar1);
          }
          uStack_80 = 0;
          local_88 = dVar21;
          do {
            local_108 = dVar20;
            uStack_100 = uVar3;
            lmpar(n,fjac,ldfjac,ipvt,diag,qtf,dVar20,&par,wa1,wa2,wa3,wa4);
            if (0 < n) {
              uVar3 = 0;
              do {
                dVar20 = wa1[uVar3];
                wa1[uVar3] = -dVar20;
                wa2[uVar3] = pdVar12[uVar3] - dVar20;
                wa3[uVar3] = diag[uVar3] * wa1[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar6 != uVar3);
            }
            local_98 = enorm(n,wa3);
            if ((int)local_118 == 1) {
              local_108 = (double)(-(ulong)(local_108 <= local_98) & (ulong)local_108 |
                                  ~-(ulong)(local_108 <= local_98) & (ulong)local_98);
              uStack_100 = uStack_100 | ~uStack_100 & extraout_XMM0_Qb_01;
            }
            uStack_90 = extraout_XMM0_Qb_01;
            local_150 = (*local_e8)(local_f0,m,n,wa2,wa4,fjac,ldfjac,1);
            *nfev = *nfev + 1;
            pdVar12 = local_110;
            if ((int)local_150 < 0) goto LAB_00101786;
            local_b0 = enorm(m,wa4);
            pdVar12 = local_110;
            local_78 = local_b0 * 0.1;
            if (0 < n) {
              lVar9 = 1;
              uVar3 = 0;
              pdVar4 = fjac;
              do {
                wa3[uVar3] = 0.0;
                dVar20 = wa1[(long)ipvt[uVar3] + -1];
                lVar8 = 0;
                do {
                  wa3[lVar8] = pdVar4[lVar8] * dVar20 + wa3[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar9 != lVar8);
                uVar3 = uVar3 + 1;
                lVar9 = lVar9 + 1;
                pdVar4 = (double *)((long)pdVar4 + local_c8);
              } while (uVar3 != uVar6);
            }
            uStack_70 = extraout_XMM0_Qb_02;
            dVar20 = enorm(n,wa3);
            if (par < 0.0) {
              local_60 = dVar20;
              dVar21 = sqrt(par);
              dVar20 = local_60;
              uVar17 = extraout_XMM0_Qb_03;
            }
            else {
              dVar21 = SQRT(par);
              uVar17 = 0;
            }
            dVar22 = 1.0 - (local_b0 / local_128) * (local_b0 / local_128);
            dVar13 = (double)-(ulong)(local_78 < local_128);
            dVar14 = (double)(~(ulong)dVar13 & 0xbff0000000000000 | (ulong)dVar13 & (ulong)dVar22);
            dVar16 = (dVar21 * local_98) / local_128;
            dVar16 = dVar16 * dVar16;
            dVar20 = (dVar20 / local_128) * (dVar20 / local_128);
            dVar15 = dVar16 + dVar16 + dVar20;
            dVar21 = (double)(-(ulong)(dVar15 != 0.0) & (ulong)(dVar14 / dVar15));
            if (dVar21 <= 0.25) {
              dVar20 = dVar20 + dVar16;
              dVar20 = (double)(~-(ulong)(dVar14 < 0.0) & 0x3fe0000000000000 |
                               (ulong)((dVar20 * -0.5) / (dVar14 * 0.5 - dVar20)) &
                               -(ulong)(dVar14 < 0.0));
              dVar14 = 0.1;
              if (local_78 < local_128 && 0.1 <= dVar20) {
                dVar14 = dVar20;
              }
              uVar1 = -(ulong)(local_108 <= local_98 / 0.1);
              uVar3 = uStack_100 | ~uStack_100 & uStack_90;
              dVar20 = (double)(uVar1 & (ulong)local_108 | ~uVar1 & (ulong)(local_98 / 0.1)) *
                       dVar14;
              par = par / dVar14;
            }
            else if ((0.75 <= dVar21) ||
                    ((dVar20 = local_108, uVar3 = uStack_100, par == 0.0 && (!NAN(par))))) {
              dVar20 = local_98 + local_98;
              par = par * 0.5;
              uVar3 = uStack_90;
            }
            dVar14 = local_128;
            uVar19 = uStack_120;
            dVar16 = local_d8;
            if (0.0001 <= dVar21) {
              if (0 < n) {
                uVar1 = 0;
                do {
                  dVar14 = wa2[uVar1];
                  pdVar12[uVar1] = dVar14;
                  wa2[uVar1] = dVar14 * diag[uVar1];
                  uVar1 = uVar1 + 1;
                } while (uVar6 != uVar1);
              }
              uStack_d0 = 0;
              uStack_90 = 0;
              uStack_120 = uStack_70;
              if (0 < m) {
                uVar1 = 0;
                do {
                  fvec[uVar1] = wa4[uVar1];
                  uVar1 = uVar1 + 1;
                } while (local_e0 != uVar1);
              }
              local_128 = dVar13;
              local_108 = dVar20;
              uStack_100 = uVar3;
              local_d8 = dVar22;
              local_98 = dVar21;
              local_78 = dVar15;
              uStack_70 = uVar17;
              dVar16 = enorm(n,wa2);
              local_118 = (ulong)((int)local_118 + 1);
              dVar14 = local_b0;
              uVar19 = 0;
              dVar21 = local_98;
              dVar15 = local_78;
              dVar22 = local_d8;
              dVar20 = local_108;
              uVar3 = uStack_100;
              dVar13 = local_128;
            }
            dVar13 = (double)(~(ulong)dVar13 & 0x3ff0000000000000 |
                             (ulong)ABS(dVar22) & (ulong)dVar13);
            bVar18 = -(local_48 < dVar15) | -(local_48 < dVar13);
            dVar22 = dVar21 * 0.5;
            uVar2 = (uint)(~bVar18 & dVar22 <= 1.0);
            uVar11 = uVar2;
            if (dVar20 <= dVar16 * local_a8) {
              uVar2 = 2;
              uVar11 = dVar22 <= 1.0 | 2;
            }
            if ((bVar18 & 1) != 0) {
              uVar11 = uVar2;
            }
            if (uVar11 != 0) goto LAB_001023a2;
            uVar2 = (uint)(maxfev <= *nfev) * 5;
            uVar11 = 6;
            if (1.0 < dVar22) {
              uVar11 = uVar2;
            }
            if (local_58 < dVar15) {
              uVar11 = uVar2;
            }
            if (local_58 < dVar13) {
              uVar11 = uVar2;
            }
            if (dVar20 <= local_58 * dVar16) {
              uVar11 = 7;
            }
            if (local_88 <= local_58) {
              uVar11 = 8;
            }
            if (uVar11 != 0) goto LAB_001023a2;
            local_128 = dVar14;
            uStack_120 = uVar19;
            local_d8 = dVar16;
          } while (dVar21 < 0.0001);
          local_108 = dVar20;
          uStack_100 = uVar3;
          local_150 = (*local_e8)(local_f0,m,n,pdVar12,fvec,fjac,ldfjac,2);
          *njev = *njev + 1;
          uVar11 = 0;
          if ((int)local_150 < 0) goto LAB_001023a2;
        }
        uVar11 = 4;
        goto LAB_001023a2;
      }
    }
  }
LAB_00101786:
  uVar11 = 0;
LAB_001023a2:
  if (0 < nprint) {
    (*local_e8)(local_f0,m,n,pdVar12,fvec,fjac,ldfjac,0);
  }
  if ((int)local_150 < 0) {
    uVar11 = local_150;
  }
  return uVar11;
}

Assistant:

__cminpack_attr__
int __cminpack_func__(lmder)(__cminpack_decl_fcnder_mn__ void *p, int m, int n, real *x, 
	real *fvec, real *fjac, int ldfjac, real ftol,
	real xtol, real gtol, int maxfev, real *
	diag, int mode, real factor, int nprint,
	int *nfev, int *njev, int *ipvt, real *qtf, 
	real *wa1, real *wa2, real *wa3, real *wa4)
{
    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p25 ((real).25)
#define p75 .75
#define p0001 1e-4

    /* System generated locals */
    real d1, d2;

    /* Local variables */
    int i, j, l;
    real par, sum;
    int iter;
    real temp, temp1, temp2;
    int iflag;
    real delta = 0.;
    real ratio;
    real fnorm, gnorm, pnorm, xnorm = 0., fnorm1, actred, dirder, 
	    epsmch, prered;
    int info;

/*     ********** */

/*     subroutine lmder */

/*     the purpose of lmder is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine lmder(fcn,m,n,x,fvec,fjac,ldfjac,ftol,xtol,gtol, */
/*                        maxfev,diag,mode,factor,nprint,info,nfev, */
/*                        njev,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,fjac,ldfjac,iflag) */
/*         integer m,n,ldfjac,iflag */
/*         double precision x(n),fvec(m),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmder. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.).100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x, fvec, and fjac */
/*         available for printing. fvec and fjac should not be */
/*         altered. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn with iflag = 1 has */
/*                   reached maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

    info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (n <= 0 || m < n || ldfjac < m || ftol < 0. || xtol < 0. || 
	    gtol < 0. || maxfev <= 0 || factor <= 0.) {
	goto TERMINATE;
    }
    if (mode == 2) {
        for (j = 0; j < n; ++j) {
            if (diag[j] <= 0.) {
                goto TERMINATE;
            }
        }
    }

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 1);
    *nfev = 1;
    if (iflag < 0) {
	goto TERMINATE;
    }
    fnorm = __cminpack_func__(enorm)(m, fvec);

/*     initialize levenberg-marquardt parameter and iteration counter. */

    par = 0.;
    iter = 1;

/*     beginning of the outer loop. */

    for (;;) {

/*        calculate the jacobian matrix. */

        iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 2);
        ++(*njev);
        if (iflag < 0) {
            goto TERMINATE;
        }

/*        if requested, call fcn to enable printing of iterates. */

        if (nprint > 0) {
            iflag = 0;
            if ((iter - 1) % nprint == 0) {
                iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 0);
            }
            if (iflag < 0) {
                goto TERMINATE;
            }
        }

/*        compute the qr factorization of the jacobian. */

        __cminpack_func__(qrfac)(m, n, fjac, ldfjac, TRUE_, ipvt, n,
              wa1, wa2, wa3);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

        if (iter == 1) {
            if (mode != 2) {
                for (j = 0; j < n; ++j) {
                    diag[j] = wa2[j];
                    if (wa2[j] == 0.) {
                        diag[j] = 1.;
                    }
                }
            }

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

            for (j = 0; j < n; ++j) {
                wa3[j] = diag[j] * x[j];
            }
            xnorm = __cminpack_func__(enorm)(n, wa3);
            delta = factor * xnorm;
            if (delta == 0.) {
                delta = factor;
            }
        }

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

        for (i = 0; i < m; ++i) {
            wa4[i] = fvec[i];
        }
        for (j = 0; j < n; ++j) {
            if (fjac[j + j * ldfjac] != 0.) {
                sum = 0.;
                for (i = j; i < m; ++i) {
                    sum += fjac[i + j * ldfjac] * wa4[i];
                }
                temp = -sum / fjac[j + j * ldfjac];
                for (i = j; i < m; ++i) {
                    wa4[i] += fjac[i + j * ldfjac] * temp;
                }
            }
            fjac[j + j * ldfjac] = wa1[j];
            qtf[j] = wa4[j];
        }

/*        compute the norm of the scaled gradient. */

        gnorm = 0.;
        if (fnorm != 0.) {
            for (j = 0; j < n; ++j) {
                l = ipvt[j]-1;
                if (wa2[l] != 0.) {
                    sum = 0.;
                    for (i = 0; i <= j; ++i) {
                        sum += fjac[i + j * ldfjac] * (qtf[i] / fnorm);
                    }
                    /* Computing MAX */
                    d1 = fabs(sum / wa2[l]);
                    gnorm = max(gnorm,d1);
                }
            }
        }

/*        test for convergence of the gradient norm. */

        if (gnorm <= gtol) {
            info = 4;
        }
        if (info != 0) {
            goto TERMINATE;
        }

/*        rescale if necessary. */

        if (mode != 2) {
            for (j = 0; j < n; ++j) {
                /* Computing MAX */
                d1 = diag[j], d2 = wa2[j];
                diag[j] = max(d1,d2);
            }
        }

/*        beginning of the inner loop. */

        do {

/*           determine the levenberg-marquardt parameter. */

            __cminpack_func__(lmpar)(n, fjac, ldfjac, ipvt, diag, qtf, delta,
                  &par, wa1, wa2, wa3, wa4);

/*           store the direction p and x + p. calculate the norm of p. */

            for (j = 0; j < n; ++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j] * wa1[j];
            }
            pnorm = __cminpack_func__(enorm)(n, wa3);

/*           on the first iteration, adjust the initial step bound. */

            if (iter == 1) {
                delta = min(delta,pnorm);
            }

/*           evaluate the function at x + p and calculate its norm. */

            iflag = fcnder_mn(p, m, n, wa2, wa4, fjac, ldfjac, 1);
            ++(*nfev);
            if (iflag < 0) {
                goto TERMINATE;
            }
            fnorm1 = __cminpack_func__(enorm)(m, wa4);

/*           compute the scaled actual reduction. */

            actred = -1.;
            if (p1 * fnorm1 < fnorm) {
                /* Computing 2nd power */
                d1 = fnorm1 / fnorm;
                actred = 1 - d1 * d1;
            }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

            for (j = 0; j < n; ++j) {
                wa3[j] = 0.;
                l = ipvt[j]-1;
                temp = wa1[l];
                for (i = 0; i <= j; ++i) {
                    wa3[i] += fjac[i + j * ldfjac] * temp;
                }
            }
            temp1 = __cminpack_func__(enorm)(n, wa3) / fnorm;
            temp2 = (sqrt(par) * pnorm) / fnorm;
            prered = temp1 * temp1 + temp2 * temp2 / p5;
            dirder = -(temp1 * temp1 + temp2 * temp2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

            ratio = 0.;
            if (prered != 0.) {
                ratio = actred / prered;
            }

/*           update the step bound. */

            if (ratio <= p25) {
                if (actred >= 0.) {
                    temp = p5;
                } else {
                    temp = p5 * dirder / (dirder + p5 * actred);
                }
                if (p1 * fnorm1 >= fnorm || temp < p1) {
                    temp = p1;
                }
                /* Computing MIN */
                d1 = pnorm / p1;
                delta = temp * min(delta,d1);
                par /= temp;
            } else {
                if (par == 0. || ratio >= p75) {
                    delta = pnorm / p5;
                    par = p5 * par;
                }
            }

/*           test for successful iteration. */

            if (ratio >= p0001) {

/*           successful iteration. update x, fvec, and their norms. */

                for (j = 0; j < n; ++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j] * x[j];
                }
                for (i = 0; i < m; ++i) {
                    fvec[i] = wa4[i];
                }
                xnorm = __cminpack_func__(enorm)(n, wa2);
                fnorm = fnorm1;
                ++iter;
            }

/*           tests for convergence. */

            if (fabs(actred) <= ftol && prered <= ftol && p5 * ratio <= 1.) {
                info = 1;
            }
            if (delta <= xtol * xnorm) {
                info = 2;
            }
            if (fabs(actred) <= ftol && prered <= ftol && p5 * ratio <= 1. && info == 2) {
                info = 3;
            }
            if (info != 0) {
                goto TERMINATE;
            }

/*           tests for termination and stringent tolerances. */

            if (*nfev >= maxfev) {
                info = 5;
            }
            if (fabs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= 1.) {
                info = 6;
            }
            if (delta <= epsmch * xnorm) {
                info = 7;
            }
            if (gnorm <= epsmch) {
                info = 8;
            }
            if (info != 0) {
                goto TERMINATE;
            }

/*           end of the inner loop. repeat if iteration unsuccessful. */

        } while (ratio < p0001);

/*        end of the outer loop. */

    }
TERMINATE:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	info = iflag;
    }
    if (nprint > 0) {
	fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 0);
    }
    return info;

/*     last card of subroutine lmder. */

}